

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O1

void cmCMakePresetsErrors::INVALID_ROOT(Value *value,cmJSONState *state)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Invalid root object","");
  cmJSONState::AddErrorAtValue(state,&local_40,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void INVALID_ROOT(const Json::Value* value, cmJSONState* state)
{
  state->AddErrorAtValue("Invalid root object", value);
}